

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::ArrayBuilder<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry>::
removeLast(ArrayBuilder<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry>
           *this)

{
  long lVar1;
  
  lVar1 = *(long *)(this + 8);
  *(long *)(this + 8) = lVar1 + -0x28;
  ArrayBuilder<capnp::_::RawSchema_*>::dispose
            ((ArrayBuilder<capnp::_::RawSchema_*> *)(lVar1 + -0x20));
  return;
}

Assistant:

void removeLast() {
    KJ_IREQUIRE(pos > ptr, "No elements present to remove.");
    kj::dtor(*--pos);
  }